

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<char>::assign<unsigned_char*,q20::identity>
          (QArrayDataPointer<char> *this,char *first,char *last)

{
  char *pcVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar8 = (long)last - (long)first;
  pDVar2 = this->d;
  if (pDVar2 != (Data *)0x0) {
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar2 == (Data *)0x0) {
        lVar7 = 0;
      }
      else {
        lVar7 = (pDVar2->super_QArrayData).alloc;
      }
      if (lVar8 <= lVar7) goto LAB_00239454;
    }
    if (pDVar2 != (Data *)0x0) {
      lVar7 = (pDVar2->super_QArrayData).alloc;
      if (lVar7 <= lVar8) {
        lVar7 = lVar8;
      }
      if (((pDVar2->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
           super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
        lVar8 = lVar7;
      }
    }
  }
  local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pcVar4 = (char *)QArrayData::allocate1(&local_30,lVar8,KeepSize);
  pQVar3 = &this->d->super_QArrayData;
  this->d = (Data *)local_30;
  this->ptr = pcVar4;
  this->size = 0;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,1,0x10);
    }
  }
LAB_00239454:
  pcVar4 = this->ptr;
  lVar8 = (long)pcVar4 -
          ((ulong)((long)&this->d[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0);
  if (this->d == (Data *)0x0) {
    lVar8 = 0;
  }
  lVar7 = this->size;
  pcVar5 = pcVar4 + -lVar8;
  if (lVar8 != 0) {
    lVar9 = -lVar8;
    this->ptr = pcVar4 + -lVar8;
    do {
      if (first == last) {
        pcVar6 = pcVar4 + lVar9;
        goto LAB_0023950e;
      }
      pcVar4[lVar9] = *first;
      first = first + 1;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0);
    this->size = this->size + lVar8;
    pcVar5 = pcVar4;
  }
  pcVar6 = pcVar5;
  if (first != last) {
    lVar8 = 0;
    do {
      pcVar6 = pcVar5 + lVar8;
      if (pcVar6 == pcVar4 + lVar7) {
        if (0 < (long)(last + (-lVar8 - (long)first))) {
          pcVar4 = last + (-lVar8 - (long)first) + 1;
          lVar7 = 0;
          do {
            pcVar5[lVar8 + lVar7] = first[lVar8 + lVar7];
            pcVar4 = pcVar4 + -1;
            lVar7 = lVar7 + 1;
          } while (1 < (long)pcVar4);
          pcVar6 = pcVar5 + lVar7 + lVar8;
        }
        goto LAB_0023950e;
      }
      pcVar1 = first + lVar8;
      *pcVar6 = *pcVar1;
      lVar8 = lVar8 + 1;
    } while (pcVar1 + 1 != last);
    pcVar6 = pcVar5 + lVar8;
  }
LAB_0023950e:
  this->size = (long)pcVar6 - (long)this->ptr;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void assign(InputIterator first, InputIterator last, Projection proj = {})
    {
        // This function only provides the basic exception guarantee.
        constexpr bool IsFwdIt = std::is_convertible_v<
                typename std::iterator_traits<InputIterator>::iterator_category,
                std::forward_iterator_tag>;
        constexpr bool IsIdentity = std::is_same_v<Projection, q20::identity>;

        if constexpr (IsFwdIt) {
            const qsizetype n = std::distance(first, last);
            if (needsDetach() || n > constAllocatedCapacity()) {
                QArrayDataPointer allocated(detachCapacity(n));
                swap(allocated);
            }
        } else if (needsDetach()) {
            QArrayDataPointer allocated(allocatedCapacity());
            swap(allocated);
            // We don't want to copy data that we know we'll overwrite
        }

        auto offset = freeSpaceAtBegin();
        const auto capacityBegin = begin() - offset;
        const auto prependBufferEnd = begin();

        if constexpr (!std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
            // If construction can throw, and we have freeSpaceAtBegin(),
            // it's easiest to just clear the container and start fresh.
            // The alternative would be to keep track of two active, disjoint ranges.
            if (offset) {
                (*this)->truncate(0);
                setBegin(capacityBegin);
                offset = 0;
            }
        }

        auto dst = capacityBegin;
        const auto dend = end();
        if (offset) { // avoids dead stores
            setBegin(capacityBegin); // undo prepend optimization

            // By construction, the following loop is nothrow!
            // (otherwise, we can't reach here)
            // Assumes InputIterator operations don't throw.
            // (but we can't statically assert that, as these operations
            //  have preconditons, so typically aren't noexcept)
            while (true) {
                if (dst == prependBufferEnd) {  // ran out of prepend buffer space
                    size += offset;
                    // we now have a contiguous buffer, continue with the main loop:
                    break;
                }
                if (first == last) {            // ran out of elements to assign
                    std::destroy(prependBufferEnd, dend);
                    size = dst - begin();
                    return;
                }
                // construct element in prepend buffer
                q20::construct_at(dst, std::invoke(proj, *first));
                ++dst;
                ++first;
            }
        }

        while (true) {
            if (first == last) {    // ran out of elements to assign
                std::destroy(dst, dend);
                break;
            }
            if (dst == dend) {      // ran out of existing elements to overwrite
                if constexpr (IsFwdIt && IsIdentity) {
                    dst = std::uninitialized_copy(first, last, dst);
                    break;
                } else if constexpr (IsFwdIt && !IsIdentity
                           && std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
                    for (; first != last; ++dst, ++first)   // uninitialized_copy with projection
                        q20::construct_at(dst, std::invoke(proj, *first));
                    break;
                } else {
                    do {
                        (*this)->emplace(size, std::invoke(proj, *first));
                    } while (++first != last);
                    return;         // size() is already correct (and dst invalidated)!
                }
            }
            *dst = std::invoke(proj, *first);    // overwrite existing element
            ++dst;
            ++first;
        }
        size = dst - begin();
    }